

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

string * json::string::parse(Pig *pig)

{
  bool bVar1;
  string *s;
  undefined1 local_38 [8];
  string value;
  Pig *pig_local;
  
  value.field_2._8_8_ = pig;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = Pig::getQuoted((Pig *)value.field_2._8_8_,0x22,(string *)local_38);
  if (bVar1) {
    pig_local = (Pig *)operator_new(0x28);
    string((string *)pig_local);
    std::__cxx11::string::operator=((string *)&((string *)pig_local)->_data,(string *)local_38);
  }
  else {
    pig_local = (Pig *)0x0;
  }
  std::__cxx11::string::~string((string *)local_38);
  return (string *)pig_local;
}

Assistant:

json::string* json::string::parse (Pig& pig)
{
  std::string value;
  if (pig.getQuoted ('"', value))
  {
    auto s = new json::string ();
    s->_data = value;
    return s;
  }

  return nullptr;
}